

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O0

void __thiscall QtMWidgets::PageViewPrivate::movePages(PageViewPrivate *this)

{
  int iVar1;
  int iVar2;
  const_reference ppQVar3;
  QPoint local_ac;
  QRect local_a4;
  QPoint local_94;
  QPoint local_8c;
  QPoint p;
  QPoint local_7c;
  QRect local_74;
  QPoint local_64;
  QPoint local_5c;
  QPoint local_54;
  QPoint p_2;
  QPoint local_44;
  QRect local_3c;
  QPoint local_2c;
  QPoint local_24;
  QPoint local_1c;
  QPoint p_1;
  int index;
  PageViewPrivate *this_local;
  
  unique0x10000300 = this;
  p_1.xp = PageControl::currentIndex(this->control);
  if (p_1.xp != 0) {
    local_3c = QWidget::rect(this->viewport);
    local_2c = QRect::topLeft(&local_3c);
    iVar1 = QWidget::width(this->viewport);
    QPoint::QPoint(&local_44,iVar1,0);
    local_24 = operator-(&local_2c,&local_44);
    QPoint::QPoint(&p_2,this->pagesOffset,0);
    local_1c = operator+(&local_24,&p_2);
    ppQVar3 = QList<QWidget_*>::at(&this->pages,(long)(p_1.xp + -1));
    QWidget::move((QPoint *)*ppQVar3);
  }
  iVar1 = p_1.xp;
  iVar2 = PageControl::count(this->control);
  if (iVar1 < iVar2 + -1) {
    local_74 = QWidget::rect(this->viewport);
    local_64 = QRect::topLeft(&local_74);
    iVar1 = QWidget::width(this->viewport);
    QPoint::QPoint(&local_7c,iVar1,0);
    local_5c = operator+(&local_64,&local_7c);
    QPoint::QPoint(&p,this->pagesOffset,0);
    local_54 = operator+(&local_5c,&p);
    ppQVar3 = QList<QWidget_*>::at(&this->pages,(long)(p_1.xp + 1));
    QWidget::move((QPoint *)*ppQVar3);
  }
  local_a4 = QWidget::rect(this->viewport);
  local_94 = QRect::topLeft(&local_a4);
  QPoint::QPoint(&local_ac,this->pagesOffset,0);
  local_8c = operator+(&local_94,&local_ac);
  ppQVar3 = QList<QWidget_*>::at(&this->pages,(long)p_1.xp);
  QWidget::move((QPoint *)*ppQVar3);
  return;
}

Assistant:

void
PageViewPrivate::movePages()
{
	const int index = control->currentIndex();

	if( index != 0 )
	{
		const QPoint p = viewport->rect().topLeft() -
			QPoint( viewport->width(), 0 ) + QPoint( pagesOffset, 0 );

		pages.at( index - 1 )->move( p );
	}

	if( index < control->count() - 1 )
	{
		const QPoint p = viewport->rect().topLeft() +
			QPoint( viewport->width(), 0 ) + QPoint( pagesOffset, 0 );

		pages.at( index + 1 )->move( p );
	}

	const QPoint p = viewport->rect().topLeft() +
		QPoint( pagesOffset, 0 );

	pages.at( index )->move( p );
}